

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JupiterAce.cpp
# Opt level: O0

int GetDeepThoughtDataOffset(Data *data)

{
  int iVar1;
  const_reference pvVar2;
  int local_1c;
  int i;
  Data *data_local;
  
  local_1c = 0;
  while( true ) {
    iVar1 = Data::size(data);
    if (iVar1 <= local_1c) {
      return 0;
    }
    pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                        (long)local_1c);
    if (((*pvVar2 == 0xff) && (iVar1 = Data::size(data), local_1c + 2 < iVar1)) &&
       (pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                            (long)(local_1c + 1)), *pvVar2 == '*')) break;
    local_1c = local_1c + 1;
  }
  return local_1c + 2;
}

Assistant:

int GetDeepThoughtDataOffset(const Data& data)
{
    for (auto i = 0; i < data.size(); ++i)
    {
        // Check for 255 sync byte
        if (data[i] != 255)
            continue;

        // If 255 is followed by 42 we've found the data start
        if ((i + 2) < data.size() && data[i + 1] == 42)
            return i + 2;
    }

    // Not found
    return 0;
}